

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DShadowProjGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture2D *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  IVec3 local_14;
  
  fVar5 = c->in[0].m_data[2];
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  pTVar4 = c->textures[0].tex2D;
  fVar6 = (float)pTVar4->m_width;
  fVar7 = (float)pTVar4->m_height;
  fVar6 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar6,c->in[1].m_data[1] * fVar7,
                     fVar6 * c->in[2].m_data[0],fVar7 * c->in[2].m_data[1]);
  pTVar4 = c->textures[0].tex2D;
  local_14.m_data[0] = 0;
  local_14.m_data[1] = 0;
  local_14.m_data[2] = 0;
  fVar5 = tcu::sampleLevelArray2DCompare
                    ((pTVar4->m_view).m_levels,(pTVar4->m_view).m_numLevels,&c->textures[0].sampler,
                     fVar5 / fVar1,fVar2 / fVar1,fVar3 / fVar1,fVar6,&local_14);
  (c->color).m_data[0] = fVar5;
  return;
}

Assistant:

static void		evalTexture2DShadowProjGrad			(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), computeLodFromGrad2D(c)); }